

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O2

int BN_mod_exp_mont_word(BIGNUM *r,ulong a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx,BN_MONT_CTX *m_ctx)

{
  int iVar1;
  tuple<bignum_st_*,_bssl::internal::Deleter> a_00;
  UniquePtr<BIGNUM> a_bignum;
  
  iVar1 = bn_minimal_width((BIGNUM *)m);
  if (iVar1 == 1) {
    a = a % *m->d;
  }
  a_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)BN_new();
  a_bignum._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       a_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
  if (a_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    iVar1 = BN_set_word((BIGNUM *)
                        a_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,a);
    if (iVar1 != 0) {
      iVar1 = BN_mod_exp_mont(r,(BIGNUM *)
                                a_00.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,p,m,ctx,m_ctx
                             );
      goto LAB_00207acf;
    }
  }
  iVar1 = 0;
  ERR_put_error(3,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                ,0x85);
LAB_00207acf:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a_bignum);
  return iVar1;
}

Assistant:

int BN_mod_exp_mont_word(BIGNUM *rr, BN_ULONG a, const BIGNUM *p,
                         const BIGNUM *m, BN_CTX *ctx,
                         const BN_MONT_CTX *mont) {
  // BN_mod_exp_mont requires reduced inputs.
  if (bn_minimal_width(m) == 1) {
    a %= m->d[0];
  }

  bssl::UniquePtr<BIGNUM> a_bignum(BN_new());
  if (a_bignum == nullptr || !BN_set_word(a_bignum.get(), a)) {
    OPENSSL_PUT_ERROR(BN, ERR_R_INTERNAL_ERROR);
    return 0;
  }

  return BN_mod_exp_mont(rr, a_bignum.get(), p, m, ctx, mont);
}